

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O1

string * __thiscall sfc::mode_abi_cxx11_(string *__return_storage_ptr__,sfc *this,Mode mode)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "snes";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "snes_mode7";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "gb";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "gbc";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "gba";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "gba_affine";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "md";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "pce";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "pce_sprite";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "ws";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "wsc";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "wsc_packed";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "ngp";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "ngpc";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "sms";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "gg";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "none";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string mode(Mode mode) {
  switch (mode) {
  case Mode::snes:
    return std::string("snes");
  case Mode::snes_mode7:
    return std::string("snes_mode7");
  case Mode::gb:
    return std::string("gb");
  case Mode::gbc:
    return std::string("gbc");
  case Mode::gba:
    return std::string("gba");
  case Mode::gba_affine:
    return std::string("gba_affine");
  case Mode::md:
    return std::string("md");
  case Mode::pce:
    return std::string("pce");
  case Mode::pce_sprite:
    return std::string("pce_sprite");
  case Mode::ws:
    return std::string("ws");
  case Mode::wsc:
    return std::string("wsc");
  case Mode::wsc_packed:
    return std::string("wsc_packed");
  case Mode::ngp:
    return std::string("ngp");
  case Mode::ngpc:
    return std::string("ngpc");
  case Mode::sms:
    return std::string("sms");
  case Mode::gg:
    return std::string("gg");
  default:
    return std::string("none");
  }
}